

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# castchannel.h
# Opt level: O1

size_t __thiscall CastMessage::size_content(CastMessage *this)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  sVar2 = ec::msg_protoc3::size_var<unsigned_int,void>
                    ((msg_protoc3 *)this,1,this->_protocol_version,true);
  pcVar1 = (this->_source_id)._M_dataplus._M_p;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    lVar7 = 0;
  }
  else {
    sVar3 = strlen(pcVar1);
    if (sVar3 == 0) {
      lVar7 = 1;
    }
    else {
      uVar5 = 0;
      lVar7 = 1;
      do {
        lVar8 = lVar7;
        uVar11 = sVar3 >> ((byte)(uVar5 + 7) & 0x3f);
        lVar7 = lVar8 + 1;
        if (0x31 < uVar5) break;
        uVar5 = uVar5 + 7;
      } while (uVar11 != 0);
      if (uVar11 != 0) {
        lVar8 = lVar7;
      }
      lVar7 = sVar3 + lVar8 + 1;
    }
  }
  pcVar1 = (this->_destination_id)._M_dataplus._M_p;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    lVar8 = 0;
  }
  else {
    sVar3 = strlen(pcVar1);
    if (sVar3 == 0) {
      lVar8 = 1;
    }
    else {
      uVar5 = 0;
      lVar8 = 1;
      do {
        lVar9 = lVar8;
        uVar11 = sVar3 >> ((byte)(uVar5 + 7) & 0x3f);
        lVar8 = lVar9 + 1;
        if (0x31 < uVar5) break;
        uVar5 = uVar5 + 7;
      } while (uVar11 != 0);
      if (uVar11 != 0) {
        lVar9 = lVar8;
      }
      lVar8 = sVar3 + lVar9 + 1;
    }
  }
  pcVar1 = (this->_namespace)._M_dataplus._M_p;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    lVar9 = 0;
  }
  else {
    sVar3 = strlen(pcVar1);
    if (sVar3 == 0) {
      lVar9 = 1;
    }
    else {
      uVar5 = 0;
      lVar9 = 1;
      do {
        lVar10 = lVar9;
        uVar11 = sVar3 >> ((byte)(uVar5 + 7) & 0x3f);
        lVar9 = lVar10 + 1;
        if (0x31 < uVar5) break;
        uVar5 = uVar5 + 7;
      } while (uVar11 != 0);
      if (uVar11 != 0) {
        lVar10 = lVar9;
      }
      lVar9 = sVar3 + lVar10 + 1;
    }
  }
  sVar4 = ec::msg_protoc3::size_var<unsigned_int,void>
                    ((msg_protoc3 *)this,5,this->_payload_type,true);
  pcVar1 = (this->_payload_utf8)._M_dataplus._M_p;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    lVar10 = 0;
  }
  else {
    sVar3 = strlen(pcVar1);
    if (sVar3 == 0) {
      lVar10 = 1;
    }
    else {
      uVar5 = 0;
      lVar10 = 1;
      do {
        lVar12 = lVar10;
        uVar11 = sVar3 >> ((byte)(uVar5 + 7) & 0x3f);
        lVar10 = lVar12 + 1;
        if (0x31 < uVar5) break;
        uVar5 = uVar5 + 7;
      } while (uVar11 != 0);
      if (uVar11 != 0) {
        lVar12 = lVar10;
      }
      lVar10 = sVar3 + lVar12 + 1;
    }
  }
  uVar5 = (this->_payload_binary)._M_string_length;
  if (uVar5 == 0 || (this->_payload_binary)._M_dataplus._M_p == (pointer)0x0) {
    lVar12 = 0;
  }
  else {
    uVar11 = 0;
    lVar12 = 1;
    do {
      lVar6 = lVar12;
      uVar13 = uVar5 >> ((byte)(uVar11 + 7) & 0x3f);
      lVar12 = lVar6 + 1;
      if (0x31 < uVar11) break;
      uVar11 = uVar11 + 7;
    } while (uVar13 != 0);
    if (uVar13 != 0) {
      lVar6 = lVar12;
    }
    lVar12 = lVar6 + uVar5 + 1;
  }
  return sVar4 + lVar10 + lVar8 + lVar9 + lVar7 + sVar2 + lVar12;
}

Assistant:

size_t size_content() override {
        return
            size_var(id_protocol_version, _protocol_version, true) +
            size_str(id_source_id, _source_id.c_str()) +
            size_str(id_destination_id, _destination_id.c_str()) +
            size_str(id_namespace, _namespace.c_str()) +
            size_var(id_payload_type, _payload_type, true) +
            size_str(id_payload_utf8, _payload_utf8.c_str()) +
            size_cls(id_payload_binary, _payload_binary.data(), _payload_binary.size());
    }